

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O2

int __thiscall spv::Builder::getScalarTypeWidth(Builder *this,Id typeId)

{
  Instruction *this_00;
  Id IVar1;
  uint uVar2;
  
  IVar1 = getScalarTypeId(this,typeId);
  this_00 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start[IVar1];
  if (this_00->opCode - OpTypeInt < 2) {
    uVar2 = Instruction::getImmediateOperand(this_00,0);
    return uVar2;
  }
  __assert_fail("getTypeClass(scalarTypeId) == OpTypeInt || getTypeClass(scalarTypeId) == OpTypeFloat"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.h"
                ,0x159,"int spv::Builder::getScalarTypeWidth(Id) const");
}

Assistant:

int getScalarTypeWidth(Id typeId) const
    {
        Id scalarTypeId = getScalarTypeId(typeId);
        assert(getTypeClass(scalarTypeId) == OpTypeInt || getTypeClass(scalarTypeId) == OpTypeFloat);
        return module.getInstruction(scalarTypeId)->getImmediateOperand(0);
    }